

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O0

void __thiscall
es::init::details_static_instances_counting::InstancesCounterZeroActivated<es::init::ActionOnZero>::
~InstancesCounterZeroActivated(InstancesCounterZeroActivated<es::init::ActionOnZero> *this)

{
  __int_type_conflict _Var1;
  ostream *this_00;
  void *this_01;
  __atomic_base<long> *in_stack_ffffffffffffffe8;
  
  _Var1 = std::__atomic_base<long>::operator--
                    ((__atomic_base<long> *)&global_static_instances_counter);
  if (_Var1 == 0) {
    ActionOnZero::operator()((ActionOnZero *)0x103275);
  }
  else {
    _Var1 = std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffffe8);
    if (_Var1 < 0) {
      this_00 = std::operator<<((ostream *)&std::cerr,"Error: negative static counter:");
      _Var1 = std::__atomic_base::operator_cast_to_long((__atomic_base<long> *)this_00);
      this_01 = (void *)std::ostream::operator<<(this_00,_Var1);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

~InstancesCounterZeroActivated() noexcept
    {
        if (--global_static_instances_counter == 0)
        {
            F{}();
            return;
        }
        if (global_static_instances_counter < 0)
        {
            std::cerr << "Error: negative static counter:" << global_static_instances_counter << std::endl;
        }
    }